

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_coroutine_status(lua_State *L)

{
  lua_State *plVar1;
  lua_State *co;
  char *s;
  lua_State *L_local;
  
  if ((L->base < L->top) && ((int)(L->base->field_4).it >> 0xf == -7)) {
    plVar1 = (lua_State *)(L->base->u64 & 0x7fffffffffff);
    if (plVar1 == L) {
      co = (lua_State *)(anon_var_dwarf_4d07d + 0x3b);
    }
    else if (plVar1->status == '\x01') {
      co = (lua_State *)anon_var_dwarf_4d0cd;
    }
    else if (plVar1->status == '\0') {
      if ((TValue *)((plVar1->stack).ptr64 + 0x10) < plVar1->base) {
        co = (lua_State *)anon_var_dwarf_4d0ef;
      }
      else if (plVar1->top == plVar1->base) {
        co = (lua_State *)anon_var_dwarf_4d0d8;
      }
      else {
        co = (lua_State *)anon_var_dwarf_4d0cd;
      }
    }
    else {
      co = (lua_State *)anon_var_dwarf_4d0d8;
    }
    lua_pushstring(L,(char *)co);
    return 1;
  }
  lj_err_arg(L,1,LJ_ERR_NOCORO);
}

Assistant:

LJLIB_CF(coroutine_status)
{
  const char *s;
  lua_State *co;
  if (!(L->top > L->base && tvisthread(L->base)))
    lj_err_arg(L, 1, LJ_ERR_NOCORO);
  co = threadV(L->base);
  if (co == L) s = "running";
  else if (co->status == LUA_YIELD) s = "suspended";
  else if (co->status != LUA_OK) s = "dead";
  else if (co->base > tvref(co->stack)+1+LJ_FR2) s = "normal";
  else if (co->top == co->base) s = "dead";
  else s = "suspended";
  lua_pushstring(L, s);
  return 1;
}